

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_andnot(_Bool copy_on_write)

{
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *prVar4;
  roaring_bitmap_t *start_density;
  roaring_bitmap_t *r2_00;
  roaring_bitmap_t *r1_00;
  byte in_DIL;
  int i_3;
  _Bool is_equal;
  roaring_bitmap_t *result;
  roaring_bitmap_t *expected;
  int j;
  int i_2;
  roaring_bitmap_t *r [10];
  int i_1;
  int ansctr;
  roaring_bitmap_t *r1_andnot_r2;
  uint32_t i;
  roaring_bitmap_t *rb1_minus_largerun;
  int d1_minus_largerun [6];
  roaring_bitmap_t *large_run_bitmap;
  roaring_bitmap_t *temp;
  roaring_bitmap_t *rb3_minus_rb2;
  int d3_minus_d2 [2];
  roaring_bitmap_t *rb3_minus_rb1;
  int d3_minus_d1 [7];
  roaring_bitmap_t *rb2_minus_rb1;
  int d2_minus_d1 [8];
  roaring_bitmap_t *rb1_minus_rb3;
  int d1_minus_d3 [9];
  roaring_bitmap_t *rb1_minus_rb2;
  int d1_minus_d2 [10];
  roaring_bitmap_t *rb3;
  int data3 [11];
  roaring_bitmap_t *rb2;
  int data2 [11];
  roaring_bitmap_t *rb1;
  int data1 [13];
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1;
  int local_268;
  int in_stack_fffffffffffffd9c;
  int *in_stack_fffffffffffffda0;
  uint32_t val;
  roaring_bitmap_t *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  int iVar5;
  int iVar6;
  roaring_bitmap_t *in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  double in_stack_fffffffffffffdc8;
  double in_stack_fffffffffffffdd0;
  uint64_t in_stack_fffffffffffffdd8;
  roaring_bitmap_t *in_stack_fffffffffffffde0;
  uint local_1f8;
  uint local_1e4;
  roaring_bitmap_t *in_stack_fffffffffffffe30;
  roaring_bitmap_t *x2;
  roaring_bitmap_t *in_stack_fffffffffffffe38;
  roaring_bitmap_t *x1;
  undefined1 local_138 [40];
  roaring_bitmap_t *local_110;
  undefined1 local_108 [40];
  roaring_bitmap_t *local_e0;
  undefined1 local_d8 [56];
  roaring_bitmap_t *local_a0;
  undefined1 local_98 [56];
  roaring_bitmap_t *local_60;
  undefined1 local_58 [64];
  roaring_bitmap_t *local_18;
  roaring_bitmap_t *local_10;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_10 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(local_10,(_Bool)(local_1 & 1));
  local_18 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(local_18,(_Bool)(local_1 & 1));
  memcpy(local_58,&DAT_0018c100,0x34);
  local_60 = roaring_from_sentinel_array
                       (in_stack_fffffffffffffda0,SUB41((uint)in_stack_fffffffffffffd9c >> 0x18,0));
  memcpy(local_98,&DAT_0018c140,0x2c);
  local_a0 = roaring_from_sentinel_array
                       (in_stack_fffffffffffffda0,SUB41((uint)in_stack_fffffffffffffd9c >> 0x18,0));
  memcpy(local_d8,&DAT_0018c170,0x2c);
  local_e0 = roaring_from_sentinel_array
                       (in_stack_fffffffffffffda0,SUB41((uint)in_stack_fffffffffffffd9c >> 0x18,0));
  memcpy(local_108,&DAT_0018c1a0,0x28);
  local_110 = roaring_from_sentinel_array
                        (in_stack_fffffffffffffda0,SUB41((uint)in_stack_fffffffffffffd9c >> 0x18,0))
  ;
  memcpy(local_138,&DAT_0018c1d0,0x24);
  roaring_from_sentinel_array
            (in_stack_fffffffffffffda0,SUB41((uint)in_stack_fffffffffffffd9c >> 0x18,0));
  roaring_from_sentinel_array
            (in_stack_fffffffffffffda0,SUB41((uint)in_stack_fffffffffffffd9c >> 0x18,0));
  roaring_from_sentinel_array
            (in_stack_fffffffffffffda0,SUB41((uint)in_stack_fffffffffffffd9c >> 0x18,0));
  roaring_from_sentinel_array
            (in_stack_fffffffffffffda0,SUB41((uint)in_stack_fffffffffffffd9c >> 0x18,0));
  roaring_bitmap_andnot(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  roaring_bitmap_equals
            (in_stack_fffffffffffffdb8,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  _assert_true(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
  roaring_bitmap_free((roaring_bitmap_t *)0x108067);
  roaring_bitmap_andnot(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  roaring_bitmap_equals
            (in_stack_fffffffffffffdb8,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  _assert_true(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
  roaring_bitmap_free((roaring_bitmap_t *)0x1080c5);
  roaring_bitmap_andnot(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  roaring_bitmap_equals
            (in_stack_fffffffffffffdb8,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  _assert_true(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
  roaring_bitmap_free((roaring_bitmap_t *)0x108123);
  roaring_bitmap_andnot(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  roaring_bitmap_equals
            (in_stack_fffffffffffffdb8,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  _assert_true(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
  roaring_bitmap_free((roaring_bitmap_t *)0x108181);
  roaring_bitmap_andnot(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  roaring_bitmap_equals
            (in_stack_fffffffffffffdb8,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  _assert_true(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
  roaring_bitmap_free((roaring_bitmap_t *)0x1081df);
  roaring_bitmap_from_range
            (in_stack_fffffffffffffdd8,(uint64_t)in_stack_fffffffffffffdd0,
             (uint32_t)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  roaring_bitmap_andnot(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  x2 = (roaring_bitmap_t *)0x14000100100002;
  x1 = (roaring_bitmap_t *)0xffffffff00150001;
  roaring_from_sentinel_array
            (in_stack_fffffffffffffda0,SUB41((uint)in_stack_fffffffffffffd9c >> 0x18,0));
  roaring_bitmap_equals
            (in_stack_fffffffffffffdb8,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  _assert_true(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
  roaring_bitmap_free((roaring_bitmap_t *)0x1082a7);
  roaring_bitmap_free((roaring_bitmap_t *)0x1082b4);
  roaring_bitmap_free((roaring_bitmap_t *)0x1082c1);
  roaring_bitmap_free((roaring_bitmap_t *)0x1082ce);
  roaring_bitmap_free((roaring_bitmap_t *)0x1082db);
  roaring_bitmap_free((roaring_bitmap_t *)0x1082e8);
  roaring_bitmap_free((roaring_bitmap_t *)0x1082f5);
  roaring_bitmap_free((roaring_bitmap_t *)0x108302);
  roaring_bitmap_free((roaring_bitmap_t *)0x10830f);
  roaring_bitmap_free((roaring_bitmap_t *)0x10831c);
  roaring_bitmap_free((roaring_bitmap_t *)0x108329);
  for (local_1e4 = 0; local_1e4 < 300; local_1e4 = local_1e4 + 1) {
    if ((local_1e4 & 1) == 0) {
      roaring_bitmap_add(in_stack_fffffffffffffde0,(uint32_t)(in_stack_fffffffffffffdd8 >> 0x20));
    }
    if (local_1e4 % 3 == 0) {
      roaring_bitmap_add(in_stack_fffffffffffffde0,(uint32_t)(in_stack_fffffffffffffdd8 >> 0x20));
    }
  }
  prVar2 = roaring_bitmap_andnot(x1,x2);
  roaring_bitmap_set_copy_on_write(prVar2,(_Bool)(local_1 & 1));
  for (local_1f8 = 0; (int)local_1f8 < 300; local_1f8 = local_1f8 + 1) {
    val = (uint32_t)((ulong)in_stack_fffffffffffffda0 >> 0x20);
    if (((int)local_1f8 % 2 == 0) && ((int)local_1f8 % 3 != 0)) {
      _Var1 = roaring_bitmap_contains(in_stack_fffffffffffffda8,val);
      if (!_Var1) {
        printf("missing %d\n",(ulong)local_1f8);
      }
    }
    else {
      _Var1 = roaring_bitmap_contains(in_stack_fffffffffffffda8,val);
      if (_Var1) {
        printf("surplus %d\n",(ulong)local_1f8);
      }
    }
  }
  roaring_bitmap_get_cardinality
            ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  _assert_int_equal(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                    (unsigned_long)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                    in_stack_fffffffffffffd9c);
  roaring_bitmap_free((roaring_bitmap_t *)0x1084aa);
  roaring_bitmap_free((roaring_bitmap_t *)0x1084b7);
  roaring_bitmap_free((roaring_bitmap_t *)0x1084c4);
  prVar2 = gen_bitmap(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                      (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),(int)in_stack_fffffffffffffdc0
                      ,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                      (int)in_stack_fffffffffffffdb8);
  prVar3 = gen_bitmap(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                      (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),(int)in_stack_fffffffffffffdc0
                      ,(int)((ulong)prVar2 >> 0x20),(int)prVar2);
  prVar4 = gen_bitmap(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                      (int)((ulong)prVar3 >> 0x20),(int)prVar3,(int)((ulong)prVar2 >> 0x20),
                      (int)prVar2);
  start_density =
       gen_bitmap(in_stack_fffffffffffffdd0,(double)prVar4,(int)((ulong)prVar3 >> 0x20),(int)prVar3,
                  (int)((ulong)prVar2 >> 0x20),(int)prVar2);
  gen_bitmap((double)start_density,(double)prVar4,(int)((ulong)prVar3 >> 0x20),(int)prVar3,
             (int)((ulong)prVar2 >> 0x20),(int)prVar2);
  gen_bitmap((double)start_density,(double)prVar4,(int)((ulong)prVar3 >> 0x20),(int)prVar3,
             (int)((ulong)prVar2 >> 0x20),(int)prVar2);
  r2_00 = gen_bitmap((double)start_density,(double)prVar4,(int)((ulong)prVar3 >> 0x20),(int)prVar3,
                     (int)((ulong)prVar2 >> 0x20),(int)prVar2);
  r1_00 = gen_bitmap((double)start_density,(double)prVar4,(int)((ulong)prVar3 >> 0x20),(int)prVar3,
                     (int)((ulong)prVar2 >> 0x20),(int)prVar2);
  gen_bitmap((double)start_density,(double)prVar4,(int)((ulong)prVar3 >> 0x20),(int)prVar3,
             (int)((ulong)prVar2 >> 0x20),(int)prVar2);
  iVar5 = 0;
  while (iVar6 = iVar5, *(long *)(&stack0xfffffffffffffdb8 + (long)iVar5 * 8) != 0) {
    while (*(long *)(&stack0xfffffffffffffdb8 + (long)iVar5 * 8) != 0) {
      prVar3 = synthesized_andnot(r1_00,r2_00);
      prVar4 = roaring_bitmap_andnot(x1,x2);
      _Var1 = roaring_bitmap_equals(prVar2,(roaring_bitmap_t *)CONCAT44(iVar6,iVar5));
      in_stack_fffffffffffffd9c = CONCAT13(_Var1,(int3)in_stack_fffffffffffffd9c);
      _assert_true(CONCAT44(iVar6,iVar5),(char *)prVar3,(char *)prVar4,in_stack_fffffffffffffd9c);
      roaring_bitmap_free((roaring_bitmap_t *)0x1086d8);
      roaring_bitmap_free((roaring_bitmap_t *)0x1086e2);
      iVar5 = iVar5 + 1;
    }
    iVar5 = iVar6 + 1;
  }
  local_268 = 0;
  while (*(long *)(&stack0xfffffffffffffdb8 + (long)local_268 * 8) != 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x108725);
    local_268 = local_268 + 1;
  }
  return;
}

Assistant:

void test_andnot(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);

    int data1[] = {1,
                   2,
                   65536 * 2 + 1,
                   65536 * 2 + 2,
                   65536 * 3 + 1,
                   65536 * 3 + 2,
                   65536 * 10 + 1,
                   65536 * 10 + 2,
                   65536 * 16 + 1,
                   65536 * 16 + 2,
                   65536 * 20 + 1,
                   65536 * 21 + 1,
                   -1};
    roaring_bitmap_t *rb1 = roaring_from_sentinel_array(data1, copy_on_write);
    int data2[] = {2,
                   3,
                   65536 * 10 + 2,
                   65536 * 10 + 3,
                   65536 * 12 + 2,
                   65536 * 12 + 3,
                   65536 * 14 + 2,
                   65536 * 14 + 3,
                   65536 * 16 + 2,
                   65536 * 16 + 3,
                   -1};
    roaring_bitmap_t *rb2 = roaring_from_sentinel_array(data2, copy_on_write);

    int data3[] = {2,
                   3,
                   65536 * 10 + 1,
                   65536 * 10 + 2,
                   65536 * 12 + 2,
                   65536 * 12 + 3,
                   65536 * 14 + 2,
                   65536 * 14 + 3,
                   65536 * 16 + 2,
                   65536 * 16 + 3,
                   -1};
    roaring_bitmap_t *rb3 = roaring_from_sentinel_array(data3, copy_on_write);
    int d1_minus_d2[] = {1,
                         65536 * 2 + 1,
                         65536 * 2 + 2,
                         65536 * 3 + 1,
                         65536 * 3 + 2,
                         65536 * 10 + 1,
                         65536 * 16 + 1,
                         65536 * 20 + 1,
                         65536 * 21 + 1,
                         -1};
    roaring_bitmap_t *rb1_minus_rb2 =
        roaring_from_sentinel_array(d1_minus_d2, copy_on_write);

    int d1_minus_d3[] = {1, 65536 * 2 + 1, 65536 * 2 + 2, 65536 * 3 + 1,
                         65536 * 3 + 2,
                         // 65536*10+1,
                         65536 * 16 + 1, 65536 * 20 + 1, 65536 * 21 + 1, -1};
    roaring_bitmap_t *rb1_minus_rb3 =
        roaring_from_sentinel_array(d1_minus_d3, copy_on_write);

    int d2_minus_d1[] = {3,
                         65536 * 10 + 3,
                         65536 * 12 + 2,
                         65536 * 12 + 3,
                         65536 * 14 + 2,
                         65536 * 14 + 3,
                         65536 * 16 + 3,
                         -1};

    roaring_bitmap_t *rb2_minus_rb1 =
        roaring_from_sentinel_array(d2_minus_d1, copy_on_write);

    int d3_minus_d1[] = {3,
                         // 65536*10+3,
                         65536 * 12 + 2, 65536 * 12 + 3, 65536 * 14 + 2,
                         65536 * 14 + 3, 65536 * 16 + 3, -1};
    roaring_bitmap_t *rb3_minus_rb1 =
        roaring_from_sentinel_array(d3_minus_d1, copy_on_write);

    int d3_minus_d2[] = {65536 * 10 + 1, -1};
    roaring_bitmap_t *rb3_minus_rb2 =
        roaring_from_sentinel_array(d3_minus_d2, copy_on_write);

    roaring_bitmap_t *temp = roaring_bitmap_andnot(rb1, rb2);
    assert_true(roaring_bitmap_equals(rb1_minus_rb2, temp));
    roaring_bitmap_free(temp);

    temp = roaring_bitmap_andnot(rb1, rb3);
    assert_true(roaring_bitmap_equals(rb1_minus_rb3, temp));
    roaring_bitmap_free(temp);

    temp = roaring_bitmap_andnot(rb2, rb1);
    assert_true(roaring_bitmap_equals(rb2_minus_rb1, temp));
    roaring_bitmap_free(temp);

    temp = roaring_bitmap_andnot(rb3, rb1);
    assert_true(roaring_bitmap_equals(rb3_minus_rb1, temp));
    roaring_bitmap_free(temp);

    temp = roaring_bitmap_andnot(rb3, rb2);
    assert_true(roaring_bitmap_equals(rb3_minus_rb2, temp));
    roaring_bitmap_free(temp);

    roaring_bitmap_t *large_run_bitmap =
        roaring_bitmap_from_range(2, 11 * 65536 + 27, 1);
    temp = roaring_bitmap_andnot(rb1, large_run_bitmap);

    int d1_minus_largerun[] = {
        1, 65536 * 16 + 1, 65536 * 16 + 2, 65536 * 20 + 1, 65536 * 21 + 1, -1};
    roaring_bitmap_t *rb1_minus_largerun =
        roaring_from_sentinel_array(d1_minus_largerun, copy_on_write);
    assert_true(roaring_bitmap_equals(rb1_minus_largerun, temp));
    roaring_bitmap_free(temp);

    roaring_bitmap_free(rb1);
    roaring_bitmap_free(rb2);
    roaring_bitmap_free(rb3);
    roaring_bitmap_free(rb1_minus_rb2);
    roaring_bitmap_free(rb1_minus_rb3);
    roaring_bitmap_free(rb2_minus_rb1);
    roaring_bitmap_free(rb3_minus_rb1);
    roaring_bitmap_free(rb3_minus_rb2);
    roaring_bitmap_free(rb1_minus_largerun);
    roaring_bitmap_free(large_run_bitmap);

    for (uint32_t i = 0; i < 300; ++i) {
        if (i % 2 == 0) roaring_bitmap_add(r1, i);
        if (i % 3 == 0) roaring_bitmap_add(r2, i);
    }

    roaring_bitmap_t *r1_andnot_r2 = roaring_bitmap_andnot(r1, r2);
    roaring_bitmap_set_copy_on_write(r1_andnot_r2, copy_on_write);

    int ansctr = 0;
    for (int i = 0; i < 300; ++i) {
        if ((i % 2 == 0) && (i % 3 != 0)) {
            ansctr++;
            if (!roaring_bitmap_contains(r1_andnot_r2, i))
                printf("missing %d\n", i);
        } else if (roaring_bitmap_contains(r1_andnot_r2, i))
            printf("surplus %d\n", i);
    }

    assert_int_equal(roaring_bitmap_get_cardinality(r1_andnot_r2), ansctr);
    roaring_bitmap_free(r1_andnot_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);

    // some tougher tests on synthetic data

    roaring_bitmap_t *r[] = {
        // ascending density, last containers might be runs
        gen_bitmap(0.0, 1e-6, 1, 0, 0, 1000000),
        // descending density, first containers might be runs
        gen_bitmap(1.0, -1e-6, 1, 0, 0, 1000000),
        // uniformly rather sparse
        gen_bitmap(1e-5, 0.0, 1, 0, 0, 2000000),
        // uniformly rather sparse with runs
        gen_bitmap(1e-5, 0.0, 3, 0, 0, 2000000),
        // uniformly rather dense
        gen_bitmap(1e-1, 0.0, 1, 0, 0, 2000000),
        // ascending density but never too dense
        gen_bitmap(0.001, 1e-7, 1, 0, 0, 1000000),
        // ascending density but very sparse
        gen_bitmap(0.0, 1e-10, 1, 0, 0, 1000000),
        // descending with a gap
        gen_bitmap(0.5, -1e-6, 1, 600000, 800000, 1000000),
        //  gap elsewhere
        gen_bitmap(1, -1e-6, 1, 300000, 500000, 1000000),
        0  // sentinel
    };

    for (int i = 0; r[i]; ++i) {
        for (int j = i; r[j]; ++j) {
            roaring_bitmap_t *expected = synthesized_andnot(r[i], r[j]);
            roaring_bitmap_t *result = roaring_bitmap_andnot(r[i], r[j]);

            bool is_equal = roaring_bitmap_equals(expected, result);

            assert_true(is_equal);
            roaring_bitmap_free(expected);
            roaring_bitmap_free(result);
        }
    }
    for (int i = 0; r[i]; ++i) roaring_bitmap_free(r[i]);
}